

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

ON_wString Internal_DumpModelfileName(ON_wString *source_3dm_file_path,bool bSourceModel)

{
  bool bVar1;
  wchar_t *pwVar2;
  char in_DL;
  undefined7 in_register_00000031;
  ON_wString file_name_stem;
  ON_wString OStack_28;
  
  pwVar2 = ON_wString::operator_cast_to_wchar_t_
                     ((ON_wString *)CONCAT71(in_register_00000031,bSourceModel));
  ON_FileSystemPath::FileNameFromPath((ON_FileSystemPath *)&OStack_28,pwVar2,false);
  bVar1 = ON_wString::IsEmpty(&OStack_28);
  if (bVar1) {
    ON_wString::ON_wString(source_3dm_file_path,&ON_wString::EmptyString);
  }
  else {
    pwVar2 = ON_wString::operator_cast_to_wchar_t_
                       ((ON_wString *)CONCAT71(in_register_00000031,bSourceModel));
    ON_FileSystemPath::VolumeAndDirectoryFromPath((ON_FileSystemPath *)source_3dm_file_path,pwVar2);
    ON_wString::operator+=(source_3dm_file_path,&OStack_28);
    ON_wString::operator+=(source_3dm_file_path,L"_ONX_ModelTest_");
    pwVar2 = L"copy";
    if (in_DL != '\0') {
      pwVar2 = L"original";
    }
    ON_wString::operator+=(source_3dm_file_path,pwVar2);
    ON_wString::operator+=(source_3dm_file_path,L"Release");
    ON_wString::operator+=(source_3dm_file_path,L".txt");
  }
  ON_wString::~ON_wString(&OStack_28);
  return (ON_wString)(wchar_t *)source_3dm_file_path;
}

Assistant:

static const ON_wString Internal_DumpModelfileName(
  const ON_wString source_3dm_file_path,
  bool bSourceModel
)
{
  ON_wString file_name_stem = ON_FileSystemPath::FileNameFromPath(source_3dm_file_path,false);
  if (file_name_stem.IsEmpty())
    return ON_wString::EmptyString;
  ON_wString text_file_path = ON_FileSystemPath::VolumeAndDirectoryFromPath(source_3dm_file_path);
  text_file_path += file_name_stem;
  text_file_path += L"_ONX_ModelTest_";
  if (bSourceModel)
    text_file_path += L"original";
  else
    text_file_path += L"copy";

#if defined(ON_RUNTIME_WIN)
#if defined(ON_64BIT_RUNTIME)
  text_file_path += L"_Win64";
#elif defined(ON_32BIT_RUNTIME)
  text_file_path += L"_Win32";
#else
  text_file_path += L"_Win";
#endif
#elif defined(ON_RUNTIME_APPLE_MACOS)
  text_file_path += L"_MacOS";
#elif defined(ON_RUNTIME_APPLE_IOS)
  text_file_path += L"_iOS";
#elif defined(ON_RUNTIME_APPLE)
  text_file_path += L"_AppleOS";
#elif defined(ON_RUNTIME_ANDROID)
  text_file_path += L"_AndroidOS";
#endif

#if defined(ON_DEBUG)
  text_file_path += L"Debug";
#else
  text_file_path += L"Release";
#endif

  text_file_path += L".txt";
  return text_file_path;
}